

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O2

void __thiscall rtc::TryCritScope::~TryCritScope(TryCritScope *this)

{
  ostream *poVar1;
  FatalMessage FStack_178;
  
  if (this->lock_was_called_ != false) {
    if (this->locked_ == true) {
      CriticalSection::Leave(this->cs_);
    }
    return;
  }
  FatalMessage::FatalMessage
            (&FStack_178,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
             ,0xcc);
  poVar1 = std::operator<<((ostream *)&FStack_178,"Check failed: lock_was_called_");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"# ");
  FatalMessage::~FatalMessage(&FStack_178);
}

Assistant:

TryCritScope::~TryCritScope() {
  CS_DEBUG_CODE(RTC_DCHECK(lock_was_called_));
  if (locked_)
    cs_->Leave();
}